

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_property.cpp
# Opt level: O0

void __thiscall lsim::StringProperty::value(StringProperty *this,int64_t val)

{
  __cxx11 local_38 [32];
  int64_t local_18;
  int64_t val_local;
  StringProperty *this_local;
  
  local_18 = val;
  val_local = (int64_t)this;
  std::__cxx11::to_string(local_38,val);
  std::__cxx11::string::operator=((string *)&this->m_value,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void StringProperty::value(int64_t val) {
    m_value = std::to_string(val);   
}